

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_gethostbyname.c
# Opt level: O0

void ares_gethostbyname_callback(void *arg,int status,int timeouts,ares_addrinfo *result)

{
  host_query_conflict *ghbn_arg;
  hostent *hostent;
  ares_addrinfo *result_local;
  int timeouts_local;
  int status_local;
  void *arg_local;
  
  ghbn_arg = (host_query_conflict *)0x0;
  hostent = (hostent *)result;
  result_local._0_4_ = timeouts;
  result_local._4_4_ = status;
  _timeouts_local = arg;
  if (status == 0) {
    result_local._4_4_ = ares_addrinfo2hostent(result,0,(hostent **)&ghbn_arg);
  }
  if (((result_local._4_4_ == ARES_SUCCESS) && (ghbn_arg != (host_query_conflict *)0x0)) &&
     ((ghbn_arg[1].callback == (ares_host_callback)0x0 || (*(long *)ghbn_arg[1].callback == 0)))) {
    result_local._4_4_ = ARES_ENODATA;
  }
  if (((result_local._4_4_ == ARES_SUCCESS) && (*(long *)(*(long *)((long)arg + 0x10) + 0x50) != 0))
     && (ghbn_arg != (host_query_conflict *)0x0)) {
    if (*(int *)&ghbn_arg->channel == 10) {
      sort6_addresses((hostent *)ghbn_arg,*(apattern **)(*(long *)((long)arg + 0x10) + 0x48),
                      *(size_t *)(*(long *)((long)arg + 0x10) + 0x50));
    }
    if (*(int *)&ghbn_arg->channel == 2) {
      sort_addresses((hostent *)ghbn_arg,*(apattern **)(*(long *)((long)arg + 0x10) + 0x48),
                     *(size_t *)(*(long *)((long)arg + 0x10) + 0x50));
    }
  }
  (**arg)(*(undefined8 *)((long)arg + 8),result_local._4_4_,(int)result_local,ghbn_arg);
  ares_freeaddrinfo((ares_addrinfo *)hostent);
  ares_free(arg);
  ares_free_hostent((hostent *)ghbn_arg);
  return;
}

Assistant:

static void ares_gethostbyname_callback(void *arg, int status, int timeouts,
                                        struct ares_addrinfo *result)
{
  struct hostent    *hostent  = NULL;
  struct host_query *ghbn_arg = arg;

  if (status == ARES_SUCCESS) {
    status = (int)ares_addrinfo2hostent(result, AF_UNSPEC, &hostent);
  }

  /* addrinfo2hostent will only return ENODATA if there are no addresses _and_
   * no cname/aliases.  However, gethostbyname will return ENODATA even if there
   * is cname/alias data */
  if (status == ARES_SUCCESS && hostent &&
      (!hostent->h_addr_list || !hostent->h_addr_list[0])) {
    status = ARES_ENODATA;
  }

  if (status == ARES_SUCCESS && ghbn_arg->channel->nsort && hostent) {
    if (hostent->h_addrtype == AF_INET6) {
      sort6_addresses(hostent, ghbn_arg->channel->sortlist,
                      ghbn_arg->channel->nsort);
    }
    if (hostent->h_addrtype == AF_INET) {
      sort_addresses(hostent, ghbn_arg->channel->sortlist,
                     ghbn_arg->channel->nsort);
    }
  }

  ghbn_arg->callback(ghbn_arg->arg, status, timeouts, hostent);

  ares_freeaddrinfo(result);
  ares_free(ghbn_arg);
  ares_free_hostent(hostent);
}